

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O3

void __thiscall
mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,TestNLHandler3>::
ReadLinearExpr<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,TestNLHandler3>::ObjHandler>
          (NLReader<mp::internal::TextReader<fmt::Locale>,TestNLHandler3> *this)

{
  int iVar1;
  
  NLReader<mp::internal::TextReader<fmt::Locale>,_TestNLHandler3>::ReadUInt
            ((NLReader<mp::internal::TextReader<fmt::Locale>,_TestNLHandler3> *)this,
             *(uint *)(*(long *)(this + 8) + 8));
  iVar1 = NLReader<mp::internal::TextReader<fmt::Locale>,_TestNLHandler3>::ReadUInt
                    ((NLReader<mp::internal::TextReader<fmt::Locale>,_TestNLHandler3> *)this,1,
                     **(int **)(this + 8) + 1);
  TextReader<fmt::Locale>::ReadTillEndOfLine(*(TextReader<fmt::Locale> **)this);
  ReadLinearExpr<mp::NLHandler<TestNLHandler3,int>::LinearExprHandler>(this,iVar1);
  return;
}

Assistant:

void NLReader<Reader, Handler>::ReadLinearExpr() {
  LinearHandler lh(*this);
  int index = ReadUInt(lh.num_items());
  // The number of terms should be less than num_vars because common
  // expressions are not allowed in a linear expression.
  int num_terms = ReadUInt(1, header_.num_vars + 1u);
  reader_.ReadTillEndOfLine();
  if (lh.SkipExpr(index))
    ReadLinearExpr(num_terms, NullLinearExprHandler());
  else
    ReadLinearExpr(num_terms, lh.OnLinearExpr(index, num_terms));
}